

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastEr0R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  RepeatedField<int> *this;
  uint *puVar8;
  ushort *puVar9;
  
  if (data.field_0._0_2_ == 0) {
    this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
    if (((ulong)this & 7) != 0) {
      AlignFail(this);
    }
    uVar1 = *(ushort *)ptr;
    aVar7 = data.field_0;
    puVar3 = (ushort *)(ptr + 3);
    while (puVar9 = puVar3, *(byte *)((long)puVar9 + -1) <= data.field_0._3_1_) {
      RepeatedField<int>::Add(this,(uint)*(byte *)((long)puVar9 + -1));
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar8 & 3) != 0) {
            AlignFail();
          }
          *puVar8 = *puVar8 | (uint)hasbits;
        }
        return (char *)puVar9;
      }
      uVar2 = *puVar9;
      aVar7.data._2_6_ = 0;
      aVar7.data._0_2_ = uVar2;
      puVar3 = (ushort *)((long)puVar9 + 3);
      if (uVar2 != uVar1) {
        uVar4 = (uint)table->fast_idx_mask & (uint)uVar2;
        if ((uVar4 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar5 = (ulong)(uVar4 & 0xfffffff8);
        pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                   (msg,puVar9,ctx,
                                    aVar7.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                    table,hasbits);
        return pcVar6;
      }
    }
    ptr = (char *)((long)puVar9 + -3);
    data.field_0 = aVar7;
  }
  pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr0R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnumSmallRange<uint16_t, 0>(
      PROTOBUF_TC_PARAM_PASS);
}